

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfRelocator.cpp
# Opt level: O1

vector<ArFileEntry,_std::allocator<ArFileEntry>_> *
loadArArchive(vector<ArFileEntry,_std::allocator<ArFileEntry>_> *__return_storage_ptr__,
             path *inputName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ByteArray *this;
  char cVar2;
  size_type sVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  size_t start;
  long lVar8;
  int iVar9;
  ArFileEntry entry;
  ByteArray input;
  char fileName [17];
  value_type local_d0;
  ByteArray local_98;
  vector<ArFileEntry,_std::allocator<ArFileEntry>_> *local_80;
  path local_78;
  string local_50;
  
  ByteArray::fromFile(&local_98,inputName,0,0);
  (__return_storage_ptr__->super__Vector_base<ArFileEntry,_std::allocator<ArFileEntry>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ArFileEntry,_std::allocator<ArFileEntry>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ArFileEntry,_std::allocator<ArFileEntry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = __return_storage_ptr__;
  if ((local_98.size_ < 8) || (*(long *)local_98.data_ != 0xa3e686372613c21)) {
    if ((3 < local_98.size_) && (*(int *)local_98.data_ == 0x464c457f)) {
      paVar1 = &local_d0.name.field_2;
      local_d0.name._M_string_length = 0;
      local_d0.name.field_2._M_local_buf[0] = '\0';
      this = &local_d0.data;
      local_d0.name._M_dataplus._M_p = (pointer)paVar1;
      ByteArray::ByteArray(this);
      ghc::filesystem::path::filename(&local_78,inputName);
      ghc::filesystem::path::u8string_abi_cxx11_(&local_50,&local_78);
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      ghc::filesystem::path::~path(&local_78);
      ByteArray::operator=(this,&local_98);
      std::vector<ArFileEntry,_std::allocator<ArFileEntry>_>::push_back
                (__return_storage_ptr__,&local_d0);
      ByteArray::~ByteArray(this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0.name._M_dataplus._M_p,
                        CONCAT71(local_d0.name.field_2._M_allocated_capacity._1_7_,
                                 local_d0.name.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  else if (8 < local_98.size_) {
    paVar1 = &local_d0.name.field_2;
    uVar7 = 8;
    do {
      start = uVar7 + 0x3c;
      lVar8 = 0;
      iVar6 = 0;
      do {
        iVar9 = (int)*(char *)((long)local_98.data_ + lVar8 + uVar7 + 0x30);
        if (iVar9 == 0x20) break;
        iVar6 = iVar9 + iVar6 * 10 + -0x30;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 10);
      if (*(int *)((long)local_98.data_ + start) == 0x464c457f) {
        local_78._path.field_2._M_local_buf[0] = '\0';
        uVar5 = 0;
        do {
          cVar2 = *(char *)((long)local_98.data_ + uVar5 + uVar7);
          if (cVar2 == ' ') {
            if (uVar5 != 0) {
              uVar4 = (int)uVar5 - 1;
              uVar5 = uVar5 & 0xffffffff;
              if (*(char *)((long)&local_78._path._M_dataplus._M_p + (ulong)uVar4) == '/') {
                uVar5 = (ulong)uVar4;
              }
            }
            *(undefined1 *)((long)&local_78._path._M_dataplus._M_p + (long)(int)uVar5) = 0;
            break;
          }
          *(char *)((long)&local_78._path._M_dataplus._M_p + uVar5) = cVar2;
          uVar5 = uVar5 + 1;
        } while (uVar5 != 0x10);
        local_d0.name._M_string_length = 0;
        local_d0.name.field_2._M_local_buf[0] = '\0';
        local_d0.name._M_dataplus._M_p = (pointer)paVar1;
        ByteArray::ByteArray(&local_d0.data);
        sVar3 = local_d0.name._M_string_length;
        strlen((char *)&local_78);
        __return_storage_ptr__ = local_80;
        std::__cxx11::string::_M_replace((ulong)&local_d0,0,(char *)sVar3,(ulong)&local_78);
        ByteArray::mid((ByteArray *)&local_50,&local_98,start,(long)iVar6);
        ByteArray::operator=(&local_d0.data,(ByteArray *)&local_50);
        ByteArray::~ByteArray((ByteArray *)&local_50);
        std::vector<ArFileEntry,_std::allocator<ArFileEntry>_>::push_back
                  (__return_storage_ptr__,&local_d0);
        ByteArray::~ByteArray(&local_d0.data);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.name._M_dataplus._M_p != paVar1) {
          operator_delete(local_d0.name._M_dataplus._M_p,
                          CONCAT71(local_d0.name.field_2._M_allocated_capacity._1_7_,
                                   local_d0.name.field_2._M_local_buf[0]) + 1);
        }
      }
      lVar8 = start + (long)iVar6;
      uVar7 = (ulong)((uint)lVar8 & 1) + lVar8;
    } while (uVar7 < local_98.size_);
  }
  ByteArray::~ByteArray(&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ArFileEntry> loadArArchive(const fs::path& inputName)
{
	ByteArray input = ByteArray::fromFile(inputName);
	std::vector<ArFileEntry> result;

	if (input.size() < 8 || memcmp(input.data(),"!<arch>\n",8) != 0)
	{
		if (input.size() < 4 || memcmp(input.data(),"\x7F""ELF",4) != 0)
			return result;

		ArFileEntry entry;
		entry.name = inputName.filename().u8string();
		entry.data = input;
		result.push_back(entry);
		return result;
	}

	size_t pos = 8;
	while (pos < input.size())
	{
		ArFileHeader* header = (ArFileHeader*) input.data(pos);
		pos += sizeof(ArFileHeader);
		
		// get file size
		int size = 0;
		for (int i = 0; i < 10; i++)
		{
			if (header->fileSize[i] == ' ')
				break;

			size = size*10;
			size += (header->fileSize[i]-'0');
		}

		// only ELF files are actually interesting
		if (memcmp(input.data(pos),"\x7F""ELF",4) == 0)
		{
			// get file name
			char fileName[17];
			fileName[16] = 0;
			for (int i = 0; i < 16; i++)
			{
				if (header->fileName[i] == ' ')
				{
					// remove trailing slashes of file names
					if (i > 0 && fileName[i-1] == '/')
						i--;
					fileName[i] = 0;
					break;
				}

				fileName[i] = header->fileName[i];
			}
		
			ArFileEntry entry;
			entry.name = fileName;
			entry.data = input.mid(pos,size);
			result.push_back(entry);
		}

		pos += size;
		if (pos % 2)
			pos++;
	}

	return result;
}